

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O3

int re2::utflen(char *s)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  Rune rune;
  Rune local_1c;
  
  iVar3 = 0;
  do {
    if (*s < '\0') {
      uVar1 = chartorune(&local_1c,s);
      uVar2 = (ulong)uVar1;
    }
    else {
      uVar2 = 1;
      if (*s == '\0') {
        return iVar3;
      }
    }
    s = s + uVar2;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int
utflen(const char *s)
{
	int c;
	long n;
	Rune rune;

	n = 0;
	for(;;) {
		c = *(unsigned char*)s;
		if(c < Runeself) {
			if(c == 0)
				return n;
			s++;
		} else
			s += chartorune(&rune, s);
		n++;
	}
	return 0;
}